

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  abctime clk;
  int local_48;
  int nRuns;
  int nUnsats;
  int Lit;
  int iVar;
  int v;
  int i;
  int status;
  int nConfLimit;
  int Iter_local;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vPars_local;
  sat_solver *pSat_local;
  
  i = 100;
  local_48 = 0;
  clk._4_4_ = 0;
  status = Iter;
  _nConfLimit = vLits;
  vLits_local = vMap;
  vMap_local = vPars;
  vPars_local = (Vec_Int_t *)pSat;
  aVar5 = Abc_Clock();
  iVar1 = Vec_IntSize(vMap_local);
  iVar2 = Vec_IntSize(vLits_local);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x4ec,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Vec_IntClear(_nConfLimit);
  Vec_IntAppend(_nConfLimit,vLits_local);
  Lit = 0;
  do {
    iVar1 = Lit;
    iVar3 = Vec_IntSize(vMap_local);
    iVar2 = status;
    if (iVar3 <= iVar1) {
      iVar1 = Vec_IntSize(vLits_local);
      iVar3 = Vec_IntCountPositive(vLits_local);
      uVar4 = Vec_IntSize(vMap_local);
      printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
             (ulong)(uint)iVar2,(ulong)(uint)(iVar1 - iVar3),(ulong)uVar4,(ulong)clk._4_4_);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - aVar5);
      return local_48;
    }
    iVar1 = Vec_IntEntry(_nConfLimit,Lit);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(_nConfLimit,Lit);
      if (iVar1 != 1) {
        __assert_fail("Vec_IntEntry(vLits, v) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x4f4,
                      "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      clk._4_4_ = clk._4_4_ + 1;
      iVar1 = Vec_IntEntry(vMap_local,Lit);
      nRuns = Abc_Var2Lit(iVar1,0);
      v = sat_solver_solve((sat_solver *)vPars_local,&nRuns,&nUnsats,(long)i,0,0,0);
      if (v != 0) {
        if (v == -1) {
          local_48 = local_48 + 1;
          iVar1 = Vec_IntEntry(vLits_local,Lit);
          if (iVar1 != 1) {
            __assert_fail("Vec_IntEntry(vMap, v) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x4fd,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          Vec_IntWriteEntry(vLits_local,Lit,0);
          nRuns = Abc_LitNot(nRuns);
        }
        else {
          for (iVar = 0; iVar1 = iVar, iVar2 = Vec_IntSize(vMap_local), iVar1 < iVar2;
              iVar = iVar + 1) {
            nUnsats = Vec_IntEntry(vMap_local,iVar);
            iVar1 = Vec_IntEntry(_nConfLimit,iVar);
            if ((iVar1 != 0) &&
               (iVar1 = sat_solver_var_value((sat_solver *)vPars_local,nUnsats), iVar1 != 0)) {
              Vec_IntWriteEntry(_nConfLimit,iVar,0);
            }
          }
          iVar1 = Vec_IntEntry(_nConfLimit,Lit);
          if (iVar1 != 0) {
            __assert_fail("Vec_IntEntry(vLits, v) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x507,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
        }
      }
    }
    Lit = Lit + 1;
  } while( true );
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}